

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::PackedFieldHelper<9>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  LogMessage *this;
  LogMessage *other;
  uint in_stack_0000000c;
  LogMessage *in_stack_00000010;
  char *in_stack_ffffffffffffff78;
  LogMessage *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  LogMessage local_50;
  
  LogMessage::LogMessage
            (&local_50,(LogLevel)((ulong)in_stack_ffffffffffffff88 >> 0x20),
             (char *)in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  LogMessage::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  LogMessage::operator<<(in_stack_00000010,in_stack_0000000c);
  this = LogMessage::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  other = LogMessage::operator<<(in_stack_00000010,in_stack_0000000c);
  LogFinisher::operator=((LogFinisher *)this,other);
  LogMessage::~LogMessage((LogMessage *)0x5c1a44);
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    GOOGLE_LOG(FATAL) << "Not implemented field number " << md.tag << " with type "
               << md.type;
  }